

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_wlanhostop(compiler_state_t *cstate,u_char *eaddr,int dir)

{
  bpf_abs_offset *pbVar1;
  block *pbVar2;
  block *pbVar3;
  block *pbVar4;
  slist *psVar5;
  u_int offset;
  
  switch(dir) {
  case 0:
  case 3:
    pbVar4 = gen_wlanhostop(cstate,eaddr,1);
    pbVar2 = gen_wlanhostop(cstate,eaddr,2);
    gen_or(pbVar4,pbVar2);
    return pbVar2;
  case 1:
    pbVar1 = &cstate->off_linkhdr;
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 1;
    pbVar4->stmts = psVar5;
    pbVar2 = gen_bcmp(cstate,OR_LINKHDR,0x18,6,eaddr);
    gen_and(pbVar4,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 1;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    pbVar3 = gen_bcmp(cstate,OR_LINKHDR,0x10,6,eaddr);
    gen_and(pbVar4,pbVar3);
    gen_or(pbVar3,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 2;
    pbVar4->stmts = psVar5;
    gen_and(pbVar4,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 2;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    pbVar3 = gen_bcmp(cstate,OR_LINKHDR,10,6,eaddr);
    gen_and(pbVar4,pbVar3);
    gen_or(pbVar3,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 8;
    pbVar4->stmts = psVar5;
    gen_and(pbVar4,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 8;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    pbVar3 = gen_bcmp(cstate,OR_LINKHDR,10,6,eaddr);
    gen_and(pbVar4,pbVar3);
    gen_or(pbVar3,pbVar2);
    goto LAB_0010c810;
  case 2:
    pbVar1 = &cstate->off_linkhdr;
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 1;
    pbVar4->stmts = psVar5;
    pbVar2 = gen_bcmp(cstate,OR_LINKHDR,0x10,6,eaddr);
    gen_and(pbVar4,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,1,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 1;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    pbVar3 = gen_bcmp(cstate,OR_LINKHDR,4,6,eaddr);
    gen_and(pbVar4,pbVar3);
    gen_or(pbVar3,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 8;
    pbVar4->stmts = psVar5;
    gen_and(pbVar4,pbVar2);
    psVar5 = gen_load_absoffsetrel(cstate,pbVar1,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 8;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    pbVar3 = gen_bcmp(cstate,OR_LINKHDR,4,6,eaddr);
    gen_and(pbVar4,pbVar3);
    gen_or(pbVar3,pbVar2);
LAB_0010c810:
    psVar5 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 4;
    pbVar4->stmts = psVar5;
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    goto LAB_0010ca6d;
  case 4:
    pbVar4 = gen_wlanhostop(cstate,eaddr,1);
    pbVar2 = gen_wlanhostop(cstate,eaddr,2);
    goto LAB_0010ca6d;
  case 5:
    pbVar4 = gen_bcmp(cstate,OR_LINKHDR,4,6,eaddr);
    return pbVar4;
  case 6:
    pbVar2 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,4,0xc);
    pbVar2->sense = (uint)(pbVar2->sense == 0);
    pbVar3 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,0xc0,0xf0);
    pbVar3->sense = (uint)(pbVar3->sense == 0);
    pbVar4 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,0xd0,0xf0);
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    gen_and(pbVar3,pbVar4);
    gen_or(pbVar2,pbVar4);
    offset = 10;
    break;
  case 7:
    offset = 0x10;
    pbVar4 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,4,0xc);
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    break;
  case 8:
    pbVar4 = gen_mcmp(cstate,OR_LINKHDR,1,0x10,3,3);
    offset = 0x18;
    break;
  case 9:
    psVar5 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,0,0x10);
    pbVar4 = new_block(cstate,0x45);
    (pbVar4->s).k = 8;
    pbVar4->stmts = psVar5;
    offset = 4;
    break;
  case 10:
    pbVar2 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,4,0xc);
    pbVar2->sense = (uint)(pbVar2->sense == 0);
    pbVar3 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,0xc0,0xf0);
    pbVar3->sense = (uint)(pbVar3->sense == 0);
    pbVar4 = gen_mcmp(cstate,OR_LINKHDR,0,0x10,0xd0,0xf0);
    pbVar4->sense = (uint)(pbVar4->sense == 0);
    gen_and(pbVar3,pbVar4);
    gen_or(pbVar2,pbVar4);
    psVar5 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,0,0x10);
    pbVar2 = new_block(cstate,0x45);
    (pbVar2->s).k = 8;
    pbVar2->stmts = psVar5;
    gen_and(pbVar2,pbVar4);
    offset = 10;
    break;
  default:
    abort();
  }
  pbVar2 = gen_bcmp(cstate,OR_LINKHDR,offset,6,eaddr);
LAB_0010ca6d:
  gen_and(pbVar4,pbVar2);
  return pbVar2;
}

Assistant:

static struct block *
gen_wlanhostop(compiler_state_t *cstate, const u_char *eaddr, int dir)
{
	register struct block *b0, *b1, *b2;
	register struct slist *s;

#ifdef ENABLE_WLAN_FILTERING_PATCH
	/*
	 * TODO GV 20070613
	 * We need to disable the optimizer because the optimizer is buggy
	 * and wipes out some LD instructions generated by the below
	 * code to validate the Frame Control bits
	 */
	cstate->no_optimize = 1;
#endif /* ENABLE_WLAN_FILTERING_PATCH */

	switch (dir) {
	case Q_SRC:
		/*
		 * Oh, yuk.
		 *
		 *	For control frames, there is no SA.
		 *
		 *	For management frames, SA is at an
		 *	offset of 10 from the beginning of
		 *	the packet.
		 *
		 *	For data frames, SA is at an offset
		 *	of 10 from the beginning of the packet
		 *	if From DS is clear, at an offset of
		 *	16 from the beginning of the packet
		 *	if From DS is set and To DS is clear,
		 *	and an offset of 24 from the beginning
		 *	of the packet if From DS is set and To DS
		 *	is set.
		 */

		/*
		 * Generate the tests to be done for data frames
		 * with From DS set.
		 *
		 * First, check for To DS set, i.e. check "link[1] & 0x01".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x01;	/* To DS */
		b1->stmts = s;

		/*
		 * If To DS is set, the SA is at 24.
		 */
		b0 = gen_bcmp(cstate, OR_LINKHDR, 24, 6, eaddr);
		gen_and(b1, b0);

		/*
		 * Now, check for To DS not set, i.e. check
		 * "!(link[1] & 0x01)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b2 = new_block(cstate, JMP(BPF_JSET));
		b2->s.k = 0x01;	/* To DS */
		b2->stmts = s;
		gen_not(b2);

		/*
		 * If To DS is not set, the SA is at 16.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 16, 6, eaddr);
		gen_and(b2, b1);

		/*
		 * Now OR together the last two checks.  That gives
		 * the complete set of checks for data frames with
		 * From DS set.
		 */
		gen_or(b1, b0);

		/*
		 * Now check for From DS being set, and AND that with
		 * the ORed-together checks.
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x02;	/* From DS */
		b1->stmts = s;
		gen_and(b1, b0);

		/*
		 * Now check for data frames with From DS not set.
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b2 = new_block(cstate, JMP(BPF_JSET));
		b2->s.k = 0x02;	/* From DS */
		b2->stmts = s;
		gen_not(b2);

		/*
		 * If From DS isn't set, the SA is at 10.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 10, 6, eaddr);
		gen_and(b2, b1);

		/*
		 * Now OR together the checks for data frames with
		 * From DS not set and for data frames with From DS
		 * set; that gives the checks done for data frames.
		 */
		gen_or(b1, b0);

		/*
		 * Now check for a data frame.
		 * I.e, check "link[0] & 0x08".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x08;
		b1->stmts = s;

		/*
		 * AND that with the checks done for data frames.
		 */
		gen_and(b1, b0);

		/*
		 * If the high-order bit of the type value is 0, this
		 * is a management frame.
		 * I.e, check "!(link[0] & 0x08)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b2 = new_block(cstate, JMP(BPF_JSET));
		b2->s.k = 0x08;
		b2->stmts = s;
		gen_not(b2);

		/*
		 * For management frames, the SA is at 10.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 10, 6, eaddr);
		gen_and(b2, b1);

		/*
		 * OR that with the checks done for data frames.
		 * That gives the checks done for management and
		 * data frames.
		 */
		gen_or(b1, b0);

		/*
		 * If the low-order bit of the type value is 1,
		 * this is either a control frame or a frame
		 * with a reserved type, and thus not a
		 * frame with an SA.
		 *
		 * I.e., check "!(link[0] & 0x04)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x04;
		b1->stmts = s;
		gen_not(b1);

		/*
		 * AND that with the checks for data and management
		 * frames.
		 */
		gen_and(b1, b0);
		return b0;

	case Q_DST:
		/*
		 * Oh, yuk.
		 *
		 *	For control frames, there is no DA.
		 *
		 *	For management frames, DA is at an
		 *	offset of 4 from the beginning of
		 *	the packet.
		 *
		 *	For data frames, DA is at an offset
		 *	of 4 from the beginning of the packet
		 *	if To DS is clear and at an offset of
		 *	16 from the beginning of the packet
		 *	if To DS is set.
		 */

		/*
		 * Generate the tests to be done for data frames.
		 *
		 * First, check for To DS set, i.e. "link[1] & 0x01".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x01;	/* To DS */
		b1->stmts = s;

		/*
		 * If To DS is set, the DA is at 16.
		 */
		b0 = gen_bcmp(cstate, OR_LINKHDR, 16, 6, eaddr);
		gen_and(b1, b0);

		/*
		 * Now, check for To DS not set, i.e. check
		 * "!(link[1] & 0x01)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
		b2 = new_block(cstate, JMP(BPF_JSET));
		b2->s.k = 0x01;	/* To DS */
		b2->stmts = s;
		gen_not(b2);

		/*
		 * If To DS is not set, the DA is at 4.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 4, 6, eaddr);
		gen_and(b2, b1);

		/*
		 * Now OR together the last two checks.  That gives
		 * the complete set of checks for data frames.
		 */
		gen_or(b1, b0);

		/*
		 * Now check for a data frame.
		 * I.e, check "link[0] & 0x08".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x08;
		b1->stmts = s;

		/*
		 * AND that with the checks done for data frames.
		 */
		gen_and(b1, b0);

		/*
		 * If the high-order bit of the type value is 0, this
		 * is a management frame.
		 * I.e, check "!(link[0] & 0x08)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b2 = new_block(cstate, JMP(BPF_JSET));
		b2->s.k = 0x08;
		b2->stmts = s;
		gen_not(b2);

		/*
		 * For management frames, the DA is at 4.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 4, 6, eaddr);
		gen_and(b2, b1);

		/*
		 * OR that with the checks done for data frames.
		 * That gives the checks done for management and
		 * data frames.
		 */
		gen_or(b1, b0);

		/*
		 * If the low-order bit of the type value is 1,
		 * this is either a control frame or a frame
		 * with a reserved type, and thus not a
		 * frame with an SA.
		 *
		 * I.e., check "!(link[0] & 0x04)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x04;
		b1->stmts = s;
		gen_not(b1);

		/*
		 * AND that with the checks for data and management
		 * frames.
		 */
		gen_and(b1, b0);
		return b0;

	case Q_RA:
		/*
		 * Not present in management frames; addr1 in other
		 * frames.
		 */

		/*
		 * If the high-order bit of the type value is 0, this
		 * is a management frame.
		 * I.e, check "(link[0] & 0x08)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x08;
		b1->stmts = s;

		/*
		 * Check addr1.
		 */
		b0 = gen_bcmp(cstate, OR_LINKHDR, 4, 6, eaddr);

		/*
		 * AND that with the check of addr1.
		 */
		gen_and(b1, b0);
		return (b0);

	case Q_TA:
		/*
		 * Not present in management frames; addr2, if present,
		 * in other frames.
		 */

		/*
		 * Not present in CTS or ACK control frames.
		 */
		b0 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_TYPE_CTL,
			IEEE80211_FC0_TYPE_MASK);
		gen_not(b0);
		b1 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_SUBTYPE_CTS,
			IEEE80211_FC0_SUBTYPE_MASK);
		gen_not(b1);
		b2 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_SUBTYPE_ACK,
			IEEE80211_FC0_SUBTYPE_MASK);
		gen_not(b2);
		gen_and(b1, b2);
		gen_or(b0, b2);

		/*
		 * If the high-order bit of the type value is 0, this
		 * is a management frame.
		 * I.e, check "(link[0] & 0x08)".
		 */
		s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
		b1 = new_block(cstate, JMP(BPF_JSET));
		b1->s.k = 0x08;
		b1->stmts = s;

		/*
		 * AND that with the check for frames other than
		 * CTS and ACK frames.
		 */
		gen_and(b1, b2);

		/*
		 * Check addr2.
		 */
		b1 = gen_bcmp(cstate, OR_LINKHDR, 10, 6, eaddr);
		gen_and(b2, b1);
		return b1;

	/*
	 * XXX - add BSSID keyword?
	 */
	case Q_ADDR1:
		return (gen_bcmp(cstate, OR_LINKHDR, 4, 6, eaddr));

	case Q_ADDR2:
		/*
		 * Not present in CTS or ACK control frames.
		 */
		b0 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_TYPE_CTL,
			IEEE80211_FC0_TYPE_MASK);
		gen_not(b0);
		b1 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_SUBTYPE_CTS,
			IEEE80211_FC0_SUBTYPE_MASK);
		gen_not(b1);
		b2 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_SUBTYPE_ACK,
			IEEE80211_FC0_SUBTYPE_MASK);
		gen_not(b2);
		gen_and(b1, b2);
		gen_or(b0, b2);
		b1 = gen_bcmp(cstate, OR_LINKHDR, 10, 6, eaddr);
		gen_and(b2, b1);
		return b1;

	case Q_ADDR3:
		/*
		 * Not present in control frames.
		 */
		b0 = gen_mcmp(cstate, OR_LINKHDR, 0, BPF_B, IEEE80211_FC0_TYPE_CTL,
			IEEE80211_FC0_TYPE_MASK);
		gen_not(b0);
		b1 = gen_bcmp(cstate, OR_LINKHDR, 16, 6, eaddr);
		gen_and(b0, b1);
		return b1;

	case Q_ADDR4:
		/*
		 * Present only if the direction mask has both "From DS"
		 * and "To DS" set.  Neither control frames nor management
		 * frames should have both of those set, so we don't
		 * check the frame type.
		 */
		b0 = gen_mcmp(cstate, OR_LINKHDR, 1, BPF_B,
			IEEE80211_FC1_DIR_DSTODS, IEEE80211_FC1_DIR_MASK);
		b1 = gen_bcmp(cstate, OR_LINKHDR, 24, 6, eaddr);
		gen_and(b0, b1);
		return b1;

	case Q_AND:
		b0 = gen_wlanhostop(cstate, eaddr, Q_SRC);
		b1 = gen_wlanhostop(cstate, eaddr, Q_DST);
		gen_and(b0, b1);
		return b1;

	case Q_DEFAULT:
	case Q_OR:
		b0 = gen_wlanhostop(cstate, eaddr, Q_SRC);
		b1 = gen_wlanhostop(cstate, eaddr, Q_DST);
		gen_or(b0, b1);
		return b1;
	}
	abort();
	/* NOTREACHED */
}